

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O3

BrotliDecoderErrorCode duckdb_brotli::SkipMetadataBlock(BrotliDecoderStateInternal *s)

{
  ulong uVar1;
  ulong uVar2;
  BrotliDecoderErrorCode BVar3;
  uint uVar4;
  size_t sVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  size_t __n;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  uint8_t buffer [8];
  uint8_t local_38 [8];
  
  puVar7 = local_38;
  puVar6 = local_38;
  uVar4 = s->meta_block_remaining_len;
  BVar3 = BROTLI_DECODER_SUCCESS;
  if (uVar4 != 0) {
    uVar1 = (s->br).bit_pos_;
    if (7 < uVar1) {
      uVar8 = (int)uVar1 >> 3;
      if ((int)uVar4 <= (int)uVar8) {
        uVar8 = uVar4;
      }
      if (uVar8 == 0) {
        __n = 0;
        bVar9 = false;
      }
      else {
        uVar2 = (s->br).val_;
        sVar5 = (long)(int)uVar8;
        do {
          *puVar7 = (char)uVar2;
          uVar1 = uVar1 - 8;
          uVar2 = uVar2 >> 8;
          puVar7 = puVar7 + 1;
          __n = sVar5 - 1;
          bVar9 = sVar5 != 1;
          if (uVar1 < 8) break;
          bVar10 = sVar5 != 1;
          sVar5 = __n;
        } while (bVar10);
        (s->br).val_ = uVar2;
        (s->br).bit_pos_ = uVar1;
        puVar6 = puVar7;
      }
      if (uVar1 < 0x40) {
        (s->br).val_ = (s->br).val_ & ~(-1L << ((byte)uVar1 & 0x3f));
      }
      if (bVar9) {
        puVar7 = (s->br).next_in;
        switchD_015de399::default(puVar6,puVar7,__n);
        (s->br).next_in = puVar7 + __n;
      }
      if (s->metadata_chunk_func != (brotli_decoder_metadata_chunk_func)0x0) {
        (*s->metadata_chunk_func)(s->metadata_callback_opaque,local_38,(long)(int)uVar8);
        uVar4 = s->meta_block_remaining_len;
      }
      uVar4 = uVar4 - uVar8;
      s->meta_block_remaining_len = uVar4;
      if (uVar4 == 0) {
        return BROTLI_DECODER_SUCCESS;
      }
    }
    puVar6 = (s->br).next_in;
    uVar1 = (long)(s->br).last_in - (long)puVar6;
    uVar8 = 0x40000000;
    if (uVar1 < 0x40000001) {
      uVar8 = (int)((s->br).bit_pos_ >> 3) + (int)uVar1;
    }
    if ((int)uVar4 < (int)uVar8) {
      uVar8 = uVar4;
    }
    if (0 < (int)uVar8) {
      if (s->metadata_chunk_func != (brotli_decoder_metadata_chunk_func)0x0) {
        (*s->metadata_chunk_func)(s->metadata_callback_opaque,puVar6,(size_t)uVar8);
        puVar6 = (s->br).next_in;
        uVar4 = s->meta_block_remaining_len;
      }
      (s->br).next_in = puVar6 + uVar8;
      s->meta_block_remaining_len = uVar4 - uVar8;
      if (uVar4 - uVar8 == 0) {
        return BROTLI_DECODER_SUCCESS;
      }
    }
    BVar3 = BROTLI_DECODER_NEEDS_MORE_INPUT;
  }
  return BVar3;
}

Assistant:

static BrotliDecoderErrorCode BROTLI_NOINLINE SkipMetadataBlock(BrotliDecoderState *s) {
	BrotliBitReader *br = &s->br;

	if (s->meta_block_remaining_len == 0) {
		return BROTLI_DECODER_SUCCESS;
	}

	BROTLI_DCHECK((BrotliGetAvailableBits(br) & 7) == 0);

	/* Drain accumulator. */
	if (BrotliGetAvailableBits(br) >= 8) {
		uint8_t buffer[8];
		int nbytes = (int)(BrotliGetAvailableBits(br)) >> 3;
		BROTLI_DCHECK(nbytes <= 8);
		if (nbytes > s->meta_block_remaining_len) {
			nbytes = s->meta_block_remaining_len;
		}
		BrotliCopyBytes(buffer, br, (size_t)nbytes);
		if (s->metadata_chunk_func) {
			s->metadata_chunk_func(s->metadata_callback_opaque, buffer, (size_t)nbytes);
		}
		s->meta_block_remaining_len -= nbytes;
		if (s->meta_block_remaining_len == 0) {
			return BROTLI_DECODER_SUCCESS;
		}
	}

	/* Direct access to metadata is possible. */
	int nbytes = (int)BrotliGetRemainingBytes(br);
	if (nbytes > s->meta_block_remaining_len) {
		nbytes = s->meta_block_remaining_len;
	}
	if (nbytes > 0) {
		if (s->metadata_chunk_func) {
			s->metadata_chunk_func(s->metadata_callback_opaque, br->next_in, (size_t)nbytes);
		}
		BrotliDropBytes(br, (size_t)nbytes);
		s->meta_block_remaining_len -= nbytes;
		if (s->meta_block_remaining_len == 0) {
			return BROTLI_DECODER_SUCCESS;
		}
	}

	BROTLI_DCHECK(BrotliGetRemainingBytes(br) == 0);

	return BROTLI_DECODER_NEEDS_MORE_INPUT;
}